

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynFunctionDefinition * ParseFunctionDefinition(ParseContext *ctx)

{
  uint uVar1;
  LexemeType LVar2;
  LexemeType LVar3;
  LexemeType LVar4;
  Lexeme *begin;
  long lVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  SynBase *pSVar10;
  SynBase *pSVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Lexeme *pLVar12;
  SynIdentifier *node;
  undefined4 extraout_var_04;
  SynFunctionDefinition *this;
  undefined4 extraout_var_06;
  uint uVar13;
  uint uVar14;
  char *pcVar15;
  Lexeme *pLVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  IntrusiveList<SynFunctionArgument> IVar21;
  IntrusiveList<SynBase> IVar22;
  IntrusiveList<SynIdentifier> aliases;
  TraceScope traceScope;
  SynIdentifier *local_b8;
  bool local_a0;
  IntrusiveList<SynIdentifier> local_78;
  SynFunctionArgument *local_60;
  SynIdentifier *local_58;
  SynIdentifier *pSStack_50;
  TraceScope local_40;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  
  begin = ctx->currentLexeme;
  uVar9 = (ctx->nonFunctionDefinitionLocations).bucketCount;
  uVar13 = uVar9 - 1;
  if (uVar9 != 0) {
    uVar14 = (int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1;
    uVar18 = uVar14 * -0x61c88647;
    iVar19 = 0;
    do {
      uVar18 = uVar18 & uVar13;
      uVar1 = (ctx->nonFunctionDefinitionLocations).data[uVar18].key;
      if (uVar1 == 0) break;
      if (uVar1 == uVar14) {
        return (SynFunctionDefinition *)0x0;
      }
      uVar18 = uVar18 + iVar19 + 1;
      iVar19 = iVar19 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  LVar2 = begin->type;
  if (LVar2 == lex_coroutine) {
    ctx->currentLexeme = begin + 1;
    pSVar10 = ParseType(ctx,(bool *)0x0,false);
    if (pSVar10 == (SynBase *)0x0) {
      pLVar12 = ctx->currentLexeme;
      pcVar15 = "ERROR: function return type not found after \'coroutine\'";
      goto LAB_0011659e;
    }
  }
  else {
    pSVar10 = ParseType(ctx,(bool *)0x0,false);
    if (pSVar10 == (SynBase *)0x0) {
      return (SynFunctionDefinition *)0x0;
    }
  }
  pLVar16 = ctx->currentLexeme;
  pSVar11 = ParseType(ctx,(bool *)0x0,false);
  pLVar12 = ctx->currentLexeme;
  if (pSVar11 == (SynBase *)0x0) {
    local_a0 = false;
    pSVar11 = (SynBase *)0x0;
  }
  else {
    if (pLVar12->type == lex_point) {
      local_a0 = true;
LAB_00115e50:
      pLVar16 = pLVar12 + 1;
    }
    else {
      if (pLVar12->type == lex_colon) {
        local_a0 = false;
        goto LAB_00115e50;
      }
      local_a0 = false;
      pSVar11 = (SynBase *)0x0;
    }
    ctx->currentLexeme = pLVar16;
    pLVar12 = pLVar16;
  }
  uVar9 = pSVar10->typeID;
  LVar3 = pLVar12->type;
  if (LVar3 == lex_operator) {
    ctx->currentLexeme = pLVar12 + 1;
    LVar4 = pLVar12[1].type;
    if (LVar4 == lex_oparen) {
      ctx->currentLexeme = pLVar12 + 2;
      anon_unknown.dwarf_151f2::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after \'(\' in operator definition");
      iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_b8 = (SynIdentifier *)CONCAT44(extraout_var_01,iVar19);
      pLVar12 = ctx->currentLexeme;
      if (pLVar12 <= ctx->firstLexeme) goto LAB_0011656c;
      pcVar17 = "";
      pcVar15 = "()";
    }
    else {
      if (LVar4 != lex_obracket) {
        if (0x22 < LVar4 - lex_add) {
          pcVar15 = "ERROR: invalid operator name";
          pLVar12 = pLVar12 + 1;
          goto LAB_0011659e;
        }
        pcVar15 = pLVar12[1].pos;
        uVar13 = pLVar12[1].length;
        ctx->currentLexeme = pLVar12 + 2;
        iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        local_b8 = (SynIdentifier *)CONCAT44(extraout_var_02,iVar19);
        pLVar12 = ctx->currentLexeme;
        if (pLVar12 <= ctx->firstLexeme) goto LAB_0011656c;
        goto LAB_00116034;
      }
      ctx->currentLexeme = pLVar12 + 2;
      anon_unknown.dwarf_151f2::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after \'[\' in operator definition");
      iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_b8 = (SynIdentifier *)CONCAT44(extraout_var,iVar19);
      pLVar12 = ctx->currentLexeme;
      if (pLVar12 <= ctx->firstLexeme) goto LAB_0011656c;
      pcVar17 = "";
      pcVar15 = "[]";
    }
LAB_00116037:
    SynBase::SynBase(&local_b8->super_SynBase,4,pLVar12 + -1,pLVar12 + -1);
    (local_b8->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
    (local_b8->name).begin = pcVar15;
    (local_b8->name).end = pcVar17;
    local_78.head = (SynIdentifier *)0x0;
    local_78.tail = (SynIdentifier *)0x0;
    pLVar12 = ctx->currentLexeme;
    if (pLVar12->type == lex_less) {
      do {
        ctx->currentLexeme = pLVar12 + 1;
        pcVar15 = "ERROR: \'@\' is expected after \',\' in explicit generic type alias list";
        if (local_78.head == (SynIdentifier *)0x0) {
          pcVar15 = "ERROR: \'@\' is expected before explicit generic type alias";
        }
        anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_at,pcVar15);
        bVar8 = anon_unknown.dwarf_151f2::CheckAt
                          (ctx,lex_string,
                           "ERROR: explicit generic type alias is expected after \'@\'");
        if (bVar8) {
          pLVar12 = ctx->currentLexeme;
          pcVar15 = pLVar12->pos;
          uVar13 = pLVar12->length;
          if (pLVar12->type != lex_none) {
            ctx->currentLexeme = pLVar12 + 1;
          }
          iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          node = (SynIdentifier *)CONCAT44(extraout_var_03,iVar19);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0011656c;
          pLVar12 = ctx->currentLexeme + -1;
          SynBase::SynBase((SynBase *)node,4,pLVar12,pLVar12);
          (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
          (node->name).begin = pcVar15;
          (node->name).end = pcVar15 + uVar13;
          IntrusiveList<SynIdentifier>::push_back(&local_78,node);
        }
        pLVar12 = ctx->currentLexeme;
      } while (pLVar12->type == lex_comma);
      anon_unknown.dwarf_151f2::CheckConsume
                (ctx,lex_greater,"ERROR: \'>\' not found after explicit generic type alias list");
      bVar8 = local_78.head != (SynIdentifier *)0x0;
    }
    else {
      bVar8 = false;
    }
    bVar6 = false;
  }
  else {
    if (LVar3 == lex_string) {
      pcVar15 = pLVar12->pos;
      uVar13 = pLVar12->length;
      ctx->currentLexeme = pLVar12 + 1;
      iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_b8 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar19);
      pLVar12 = ctx->currentLexeme;
      if (pLVar12 <= ctx->firstLexeme) goto LAB_0011656c;
LAB_00116034:
      pcVar17 = pcVar15 + uVar13;
      goto LAB_00116037;
    }
    if (pSVar11 != (SynBase *)0x0) {
      pcVar15 = "ERROR: function name expected after \':\' or \'.\'";
LAB_0011659e:
      anon_unknown.dwarf_151f2::Stop(ctx,pLVar12,pcVar15);
    }
    if (LVar2 == lex_coroutine && uVar9 != 5) {
      pcVar15 = "ERROR: function name not found after return type";
      goto LAB_0011659e;
    }
    local_78.head = (SynIdentifier *)0x0;
    local_78.tail = (SynIdentifier *)0x0;
    bVar6 = true;
    bVar8 = false;
    local_b8 = (SynIdentifier *)0x0;
  }
  if (((LVar2 == lex_coroutine) || (pSVar11 != (SynBase *)0x0)) || (bVar8)) {
    anon_unknown.dwarf_151f2::CheckAt(ctx,lex_oparen,"ERROR: \'(\' expected after function name");
  }
  if (((bool)(uVar9 != 5 & bVar6)) || (ctx->currentLexeme->type != lex_oparen)) {
    ctx->currentLexeme = begin;
    local_58 = (SynIdentifier *)
               CONCAT44(local_58._4_4_,(int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1
                       );
    local_40.ts._0_1_ = 1;
    SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
              (&ctx->nonFunctionDefinitionLocations,(uint *)&local_58,(bool *)&local_40);
    this = (SynFunctionDefinition *)0x0;
  }
  else {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    IVar21 = ParseFunctionArguments(ctx);
    local_60 = IVar21.head;
    anon_unknown.dwarf_151f2::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after function variable list");
    if (bVar6) {
      iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_b8 = (SynIdentifier *)CONCAT44(extraout_var_04,iVar19);
      (local_b8->super_SynBase).typeID = 4;
      (local_b8->super_SynBase).begin = (Lexeme *)0x0;
      (local_b8->super_SynBase).end = (Lexeme *)0x0;
      (local_b8->super_SynBase).pos.begin = (char *)0x0;
      (local_b8->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(local_b8->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(local_b8->super_SynBase).next + 2) = 0;
      (local_b8->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f0c0;
      (local_b8->name).begin = (char *)0x0;
      (local_b8->name).end = (char *)0x0;
    }
    if (ctx->currentLexeme->type == lex_semicolon) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
      this = (SynFunctionDefinition *)CONCAT44(extraout_var_05,iVar19);
      if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_0011656c:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      local_58 = local_78.head;
      pSStack_50 = local_78.tail;
      SynBase::SynBase((SynBase *)this,0x37,begin,ctx->currentLexeme + -1);
      (this->super_SynBase).field_0x3b = LVar2 == lex_coroutine;
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023fe48;
      (this->super_SynBase).field_0x3a = 1;
      this->parentType = pSVar11;
      this->accessor = local_a0;
      this->returnType = pSVar10;
      this->isOperator = LVar3 == lex_operator;
      this->name = local_b8;
      (this->aliases).head = local_58;
      (this->aliases).tail = pSStack_50;
      (this->arguments).head = local_60;
      (this->arguments).tail = IVar21.tail;
      (this->expressions).head = (SynBase *)0x0;
      (this->expressions).tail = (SynBase *)0x0;
    }
    else {
      anon_unknown.dwarf_151f2::CheckConsume
                (ctx,lex_ofigure,"ERROR: \'{\' not found after function header");
      if ((ParseFunctionDefinition(ParseContext&)::token == '\0') &&
         (iVar19 = __cxa_guard_acquire(&ParseFunctionDefinition(ParseContext&)::token), iVar19 != 0)
         ) {
        ParseFunctionDefinition::token = NULLC::TraceGetToken("parse","ParseFunctionBody");
        __cxa_guard_release(&ParseFunctionDefinition(ParseContext&)::token);
      }
      NULLC::TraceScope::TraceScope(&local_40,ParseFunctionDefinition::token);
      lVar7 = NULLC::traceContext;
      pcVar15 = (local_b8->name).begin;
      uVar20 = (long)(local_b8->name).end - (long)pcVar15;
      iVar19 = (int)uVar20;
      if (iVar19 != 0) {
        uVar13 = iVar19 + 1;
        uVar9 = *(uint *)(NULLC::traceContext + 0x264);
        if ((uVar9 <= *(int *)(NULLC::traceContext + 0x260) + uVar13) ||
           (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
          NULLC::TraceDump();
          uVar9 = *(uint *)(lVar7 + 0x264);
        }
        if (uVar9 <= uVar13) {
          __assert_fail("count + 1 < context.labels.max",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
        }
        uVar9 = *(uint *)(lVar7 + 0x260);
        memcpy((void *)((ulong)uVar9 + *(long *)(lVar7 + 0x268)),pcVar15,uVar20 & 0xffffffff);
        *(undefined1 *)(*(long *)(lVar7 + 0x268) + (ulong)(uint)(*(int *)(lVar7 + 0x260) + iVar19))
             = 0;
        *(int *)(lVar7 + 0x260) = *(int *)(lVar7 + 0x260) + uVar13;
        lVar5 = *(long *)(lVar7 + 0x278);
        uVar13 = *(uint *)(lVar7 + 0x270);
        *(uint *)(lVar7 + 0x270) = uVar13 + 1;
        *(uint *)(lVar5 + (ulong)uVar13 * 8) = uVar9 * 4 + 2;
        *(undefined4 *)(lVar5 + 4 + (ulong)uVar13 * 8) = 0;
      }
      IVar22 = ParseExpressions(ctx);
      anon_unknown.dwarf_151f2::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
      iVar19 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
      this = (SynFunctionDefinition *)CONCAT44(extraout_var_06,iVar19);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0011656c;
      local_58 = local_78.head;
      pSStack_50 = local_78.tail;
      SynBase::SynBase((SynBase *)this,0x37,begin,ctx->currentLexeme + -1);
      (this->super_SynBase).field_0x3b = LVar2 == lex_coroutine;
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023fe48;
      (this->super_SynBase).field_0x3a = 0;
      this->parentType = pSVar11;
      this->accessor = local_a0;
      this->returnType = pSVar10;
      this->isOperator = LVar3 == lex_operator;
      this->name = local_b8;
      (this->aliases).head = local_58;
      (this->aliases).tail = pSStack_50;
      (this->arguments).head = local_60;
      (this->arguments).tail = IVar21.tail;
      this->expressions = IVar22;
      NULLC::TraceScope::~TraceScope(&local_40);
    }
  }
  return this;
}

Assistant:

SynFunctionDefinition* ParseFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonFunctionDefinitionLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool coroutine = ctx.Consume(lex_coroutine);

	if(SynBase *returnType = ParseType(ctx))
	{
		// Check if this is a member function
		Lexeme *subLexeme = ctx.currentLexeme;

		SynBase *parentType = ParseType(ctx);
		bool accessor = false;

		if(parentType)
		{
			if(ctx.Consume(lex_colon))
			{
				accessor = false;
			}
			else if(ctx.Consume(lex_point))
			{
				accessor = true;
			}
			else
			{
				// Backtrack
				ctx.currentLexeme = subLexeme;

				parentType = NULL;
			}
		}

		bool allowEmptyName = isType<SynTypeAuto>(returnType);

		bool isOperator = ctx.Consume(lex_operator);

		SynIdentifier *nameIdentifier = NULL;

		if(isOperator)
		{
			if(ctx.Consume(lex_obracket))
			{
				CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after '[' in operator definition");

				InplaceStr name = InplaceStr("[]");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if(ctx.Consume(lex_oparen))
			{
				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after '(' in operator definition");

				InplaceStr name = InplaceStr("()");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if((ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				Stop(ctx, ctx.Current(), "ERROR: invalid operator name");
			}
		}
		else if(ctx.At(lex_string))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else if(parentType)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name expected after ':' or '.'");
		}
		else if(coroutine && !allowEmptyName)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name not found after return type");
		}

		IntrusiveList<SynIdentifier> aliases;

		if(nameIdentifier && ctx.Consume(lex_less))
		{
			do
			{
				if(aliases.empty())
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected before explicit generic type alias");
				else
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected after ',' in explicit generic type alias list");

				if(CheckAt(ctx, lex_string, "ERROR: explicit generic type alias is expected after '@'"))
				{
					InplaceStr name = ctx.Consume();
					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name));
				}
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, lex_greater, "ERROR: '>' not found after explicit generic type alias list");
		}

		if(parentType || coroutine || !aliases.empty())
			CheckAt(ctx, lex_oparen, "ERROR: '(' expected after function name");

		if((nameIdentifier == NULL && !allowEmptyName) || !ctx.Consume(lex_oparen))
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonFunctionDefinitionLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}

		IntrusiveList<SynFunctionArgument> arguments = ParseFunctionArguments(ctx);

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function variable list");

		if(!nameIdentifier)
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_semicolon))
			return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), true, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after function header");

		TRACE_SCOPE("parse", "ParseFunctionBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		expressions = ParseExpressions(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");

		return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), false, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);
	}
	else if(coroutine)
	{
		Stop(ctx, ctx.Current(), "ERROR: function return type not found after 'coroutine'");
	}

	return NULL;
}